

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.hpp
# Opt level: O3

void __thiscall license::os::DmiInfo::~DmiInfo(DmiInfo *this)

{
  pointer pcVar1;
  
  this->_vptr_DmiInfo = (_func_int **)&PTR__DmiInfo_001c7318;
  pcVar1 = (this->m_cpu_manufacturer)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_cpu_manufacturer).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_bios_description)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_bios_description).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_bios_vendor)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_bios_vendor).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_sys_vendor)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_sys_vendor).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~DmiInfo(){}